

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_map.h
# Opt level: O3

void __thiscall
ctemplate::
small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
::ConvertToRealMap(small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
                   *this)

{
  undefined1 *puVar1;
  long lVar2;
  ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> temp_array [4];
  pair<const_unsigned_long,_ctemplate::TemplateString> local_b8 [4];
  
  memcpy(local_b8,&this->field_2,0xa0);
  this->size_ = -1;
  *(UnsafeArena **)&this->field_2 = (this->functor_).arena_;
  puVar1 = (undefined1 *)((long)&this->field_2 + 0x10);
  *(undefined4 *)((long)&this->field_2 + 0x10) = 0;
  lVar2 = 0;
  *(undefined8 *)((long)&this->field_2 + 0x18) = 0;
  *(undefined1 **)((long)&this->field_2 + 0x20) = puVar1;
  *(undefined1 **)((long)&this->field_2 + 0x28) = puVar1;
  *(undefined8 *)((long)&this->field_2 + 0x30) = 0;
  do {
    std::
    _Rb_tree<unsigned_long,std::pair<unsigned_long_const,ctemplate::TemplateString>,std::_Select1st<std::pair<unsigned_long_const,ctemplate::TemplateString>>,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,ctemplate::TemplateString>,ctemplate::UnsafeArena>>
    ::_M_emplace_unique<std::pair<unsigned_long_const,ctemplate::TemplateString>&>
              ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,ctemplate::TemplateString>,std::_Select1st<std::pair<unsigned_long_const,ctemplate::TemplateString>>,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,ctemplate::TemplateString>,ctemplate::UnsafeArena>>
                *)&(this->field_2).dummy_,
               (pair<const_unsigned_long,_ctemplate::TemplateString> *)
               ((long)&local_b8[0].first + lVar2));
    lVar2 = lVar2 + 0x28;
  } while (lVar2 != 0xa0);
  return;
}

Assistant:

void ConvertToRealMap() {
    // Move the current elements into a temporary array.
    ManualConstructor<value_type> temp_array[kArraySize];

    for (int i = 0; i < kArraySize; i++) {
      temp_array[i].Init(*array_[i]);
      array_[i].Destroy();
    }

    // Initialize the map.
    size_ = -1;
    functor_(&map_);

    // Insert elements into it.
    for (int i = 0; i < kArraySize; i++) {
      map_->insert(*temp_array[i]);
      temp_array[i].Destroy();
    }
  }